

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

bool __thiscall
dap::Deserializer::
deserialize<std::vector<dap::ExceptionOptions,std::allocator<dap::ExceptionOptions>>>
          (Deserializer *this,
          optional<std::vector<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_>_> *opt
          )

{
  bool bVar1;
  undefined1 local_30 [8];
  vector<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_> v;
  optional<std::vector<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_>_> *opt_local;
  Deserializer *this_local;
  
  v.super__Vector_base<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)opt;
  std::vector<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_>::vector
            ((vector<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_> *)local_30);
  bVar1 = deserialize<dap::ExceptionOptions>
                    (this,(vector<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_> *)
                          local_30);
  if (bVar1) {
    optional<std::vector<dap::ExceptionOptions,std::allocator<dap::ExceptionOptions>>>::operator=
              ((optional<std::vector<dap::ExceptionOptions,std::allocator<dap::ExceptionOptions>>> *
               )v.super__Vector_base<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_> *)local_30);
  }
  std::vector<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_>::~vector
            ((vector<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_> *)local_30);
  return true;
}

Assistant:

bool Deserializer::deserialize(dap::optional<T>* opt) const {
  T v;
  if (deserialize(&v)) {
    *opt = v;
  }
  return true;
}